

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_variable_number *
pugi::impl::anon_unknown_0::
new_xpath_variable<pugi::impl::(anonymous_namespace)::xpath_variable_number>(char_t *name)

{
  size_t sVar1;
  void *in_RDI;
  xpath_variable_number *result;
  void *memory;
  size_t length;
  xpath_variable_number *local_8;
  
  sVar1 = strlength((char_t *)0x15f4e3);
  if (sVar1 == 0) {
    local_8 = (xpath_variable_number *)0x0;
  }
  else {
    local_8 = (xpath_variable_number *)
              (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate
              )(sVar1 + 0x20);
    if (local_8 == (xpath_variable_number *)0x0) {
      local_8 = (xpath_variable_number *)0x0;
    }
    else {
      xpath_variable_number::xpath_variable_number(local_8);
      memcpy(local_8->name,in_RDI,sVar1 + 1);
    }
  }
  return local_8;
}

Assistant:

PUGI_IMPL_FN T* new_xpath_variable(const char_t* name)
	{
		size_t length = strlength(name);
		if (length == 0) return NULL; // empty variable names are invalid

		// $$ we can't use offsetof(T, name) because T is non-POD, so we just allocate additional length characters
		void* memory = xml_memory::allocate(sizeof(T) + length * sizeof(char_t));
		if (!memory) return NULL;

		T* result = new (memory) T();

		memcpy(result->name, name, (length + 1) * sizeof(char_t));

		return result;
	}